

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

void CMakeCommandUsage(char *program)

{
  ostream *poVar1;
  char *pcVar2;
  ostringstream errorStream;
  string sStack_1a8;
  ostream local_188;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
  poVar1 = std::operator<<(&local_188,"cmake version ");
  pcVar2 = cmVersion::GetCMakeVersion();
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(&local_188,"Usage: ");
  poVar1 = std::operator<<(poVar1,program);
  poVar1 = std::operator<<(poVar1," -E <command> [arguments...]\n");
  poVar1 = std::operator<<(poVar1,"Available commands: \n");
  poVar1 = std::operator<<(poVar1,
                           "  capabilities              - Report capabilities built into cmake in JSON format\n"
                          );
  poVar1 = std::operator<<(poVar1,"  chdir dir cmd [args...]   - run command in a given directory\n"
                          );
  poVar1 = std::operator<<(poVar1,"  compare_files [--ignore-eol] file1 file2\n");
  poVar1 = std::operator<<(poVar1,
                           "                              - check if file1 is same as file2\n");
  poVar1 = std::operator<<(poVar1,
                           "  copy <file>... destination  - copy files to destination (either file or directory)\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "  copy_directory <dir>... destination   - copy content of <dir>... directories to \'destination\' directory\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "  copy_if_different <file>... destination  - copy files if it has changed\n"
                          );
  poVar1 = std::operator<<(poVar1,"  echo [<string>...]        - displays arguments as text\n");
  poVar1 = std::operator<<(poVar1,
                           "  echo_append [<string>...] - displays arguments as text but no new line\n"
                          );
  poVar1 = std::operator<<(poVar1,"  env [--unset=NAME]... [NAME=VALUE]... COMMAND [ARG]...\n");
  poVar1 = std::operator<<(poVar1,
                           "                            - run command in a modified environment\n");
  poVar1 = std::operator<<(poVar1,"  environment               - display the current environment\n")
  ;
  poVar1 = std::operator<<(poVar1,
                           "  make_directory <dir>...   - create parent and <dir> directories\n");
  poVar1 = std::operator<<(poVar1,"  md5sum <file>...          - create MD5 checksum of files\n");
  poVar1 = std::operator<<(poVar1,"  sha1sum <file>...         - create SHA1 checksum of files\n");
  poVar1 = std::operator<<(poVar1,"  sha224sum <file>...       - create SHA224 checksum of files\n")
  ;
  poVar1 = std::operator<<(poVar1,"  sha256sum <file>...       - create SHA256 checksum of files\n")
  ;
  poVar1 = std::operator<<(poVar1,"  sha384sum <file>...       - create SHA384 checksum of files\n")
  ;
  poVar1 = std::operator<<(poVar1,"  sha512sum <file>...       - create SHA512 checksum of files\n")
  ;
  poVar1 = std::operator<<(poVar1,
                           "  remove [-f] <file>...     - remove the file(s), use -f to force it\n")
  ;
  poVar1 = std::operator<<(poVar1,
                           "  remove_directory <dir>... - remove directories and their contents\n");
  poVar1 = std::operator<<(poVar1,
                           "  rename oldname newname    - rename a file or directory (on one volume)\n"
                          );
  poVar1 = std::operator<<(poVar1,"  server                    - start cmake in server mode\n");
  poVar1 = std::operator<<(poVar1,
                           "  sleep <number>...         - sleep for given number of seconds\n");
  poVar1 = std::operator<<(poVar1,"  tar [cxt][vf][zjJ] file.tar [file/dir1 file/dir2 ...]\n");
  poVar1 = std::operator<<(poVar1,
                           "                            - create or extract a tar or zip archive\n")
  ;
  poVar1 = std::operator<<(poVar1,
                           "  time command [args...]    - run command and display elapsed time\n");
  poVar1 = std::operator<<(poVar1,"  touch <file>...           - touch a <file>.\n");
  poVar1 = std::operator<<(poVar1,
                           "  touch_nocreate <file>...  - touch a <file> but do not create it.\n");
  std::operator<<(poVar1,"  create_symlink old new    - create a symbolic link new -> old\n");
  std::__cxx11::stringbuf::str();
  cmSystemTools::Error(&sStack_1a8);
  std::__cxx11::string::~string((string *)&sStack_1a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
  return;
}

Assistant:

void CMakeCommandUsage(const char* program)
{
  std::ostringstream errorStream;

#ifdef CMAKE_BUILD_WITH_CMAKE
  /* clang-format off */
  errorStream
    << "cmake version " << cmVersion::GetCMakeVersion() << "\n";
/* clang-format on */
#else
  /* clang-format off */
  errorStream
    << "cmake bootstrap\n";
/* clang-format on */
#endif
  // If you add new commands, change here,
  // and in cmakemain.cxx in the options table
  /* clang-format off */
  errorStream
    << "Usage: " << program << " -E <command> [arguments...]\n"
    << "Available commands: \n"
    << "  capabilities              - Report capabilities built into cmake "
       "in JSON format\n"
    << "  chdir dir cmd [args...]   - run command in a given directory\n"
    << "  compare_files [--ignore-eol] file1 file2\n"
    << "                              - check if file1 is same as file2\n"
    << "  copy <file>... destination  - copy files to destination "
       "(either file or directory)\n"
    << "  copy_directory <dir>... destination   - copy content of <dir>... "
       "directories to 'destination' directory\n"
    << "  copy_if_different <file>... destination  - copy files if it has "
       "changed\n"
    << "  echo [<string>...]        - displays arguments as text\n"
    << "  echo_append [<string>...] - displays arguments as text but no new "
       "line\n"
    << "  env [--unset=NAME]... [NAME=VALUE]... COMMAND [ARG]...\n"
    << "                            - run command in a modified environment\n"
    << "  environment               - display the current environment\n"
    << "  make_directory <dir>...   - create parent and <dir> directories\n"
    << "  md5sum <file>...          - create MD5 checksum of files\n"
    << "  sha1sum <file>...         - create SHA1 checksum of files\n"
    << "  sha224sum <file>...       - create SHA224 checksum of files\n"
    << "  sha256sum <file>...       - create SHA256 checksum of files\n"
    << "  sha384sum <file>...       - create SHA384 checksum of files\n"
    << "  sha512sum <file>...       - create SHA512 checksum of files\n"
    << "  remove [-f] <file>...     - remove the file(s), use -f to force "
       "it\n"
    << "  remove_directory <dir>... - remove directories and their contents\n"
    << "  rename oldname newname    - rename a file or directory "
       "(on one volume)\n"
    << "  server                    - start cmake in server mode\n"
    << "  sleep <number>...         - sleep for given number of seconds\n"
    << "  tar [cxt][vf][zjJ] file.tar [file/dir1 file/dir2 ...]\n"
    << "                            - create or extract a tar or zip archive\n"
    << "  time command [args...]    - run command and display elapsed time\n"
    << "  touch <file>...           - touch a <file>.\n"
    << "  touch_nocreate <file>...  - touch a <file> but do not create it.\n"
    << "  create_symlink old new    - create a symbolic link new -> old\n"
#if defined(_WIN32) && !defined(__CYGWIN__)
    << "Available on Windows only:\n"
    << "  delete_regv key           - delete registry value\n"
    << "  env_vs8_wince sdkname     - displays a batch file which sets the "
       "environment for the provided Windows CE SDK installed in VS2005\n"
    << "  env_vs9_wince sdkname     - displays a batch file which sets the "
       "environment for the provided Windows CE SDK installed in VS2008\n"
    << "  write_regv key value      - write registry value\n"
#endif
    ;
  /* clang-format on */

  cmSystemTools::Error(errorStream.str());
}